

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

VkResult __thiscall
VmaBlockVector::CommitAllocationRequest
          (VmaBlockVector *this,VmaAllocationRequest *allocRequest,VmaDeviceMemoryBlock *pBlock,
          VkDeviceSize alignment,VmaAllocationCreateFlags allocFlags,void *pUserData,
          VmaSuballocationType suballocType,VmaAllocation *pAllocation)

{
  atomic<unsigned_long> *paVar1;
  atomic<unsigned_int> *paVar2;
  uint32_t uVar3;
  uint uVar4;
  VmaAllocHandle pVVar5;
  VkDeviceSize VVar6;
  VmaAllocator pVVar7;
  VkResult VVar8;
  VmaAllocation pVVar9;
  bool isMappingAllowed;
  bool local_39;
  char *local_38;
  
  local_39 = (allocFlags & 0xc00) != 0;
  VmaMappingHysteresis::PostAlloc(&pBlock->m_MappingHysteresis);
  if (((allocFlags & 4) != 0) &&
     (VVar8 = VmaDeviceMemoryBlock::Map(pBlock,this->m_hAllocator,1,(void **)0x0),
     VVar8 != VK_SUCCESS)) {
    return VVar8;
  }
  local_38 = (char *)pUserData;
  pVVar9 = VmaAllocationObjectAllocator::Allocate<bool_const&>
                     (&this->m_hAllocator->m_AllocationObjectAllocator,&local_39);
  *pAllocation = pVVar9;
  (*pBlock->m_pMetadata->_vptr_VmaBlockMetadata[0x13])
            (pBlock->m_pMetadata,allocRequest,(ulong)suballocType,pVVar9);
  pVVar9 = *pAllocation;
  pVVar5 = allocRequest->allocHandle;
  VVar6 = allocRequest->size;
  uVar3 = this->m_MemoryTypeIndex;
  pVVar9->m_Type = '\x01';
  pVVar9->m_Alignment = alignment;
  pVVar9->m_Size = VVar6;
  pVVar9->m_MemoryTypeIndex = uVar3;
  if ((allocFlags & 4) != 0) {
    pVVar9->m_Flags = pVVar9->m_Flags | 1;
  }
  pVVar9->m_SuballocationType = (uint8_t)suballocType;
  (pVVar9->field_0).m_BlockAllocation.m_Block = pBlock;
  (pVVar9->field_0).m_BlockAllocation.m_AllocHandle = pVVar5;
  if ((allocFlags & 0x20) == 0) {
    (*pAllocation)->m_pUserData = local_38;
  }
  else {
    VmaAllocation_T::SetName(*pAllocation,this->m_hAllocator,local_38);
  }
  pVVar7 = this->m_hAllocator;
  uVar4 = (pVVar7->m_MemProps).memoryTypes[this->m_MemoryTypeIndex].heapIndex;
  LOCK();
  paVar1 = (pVVar7->m_Budget).m_AllocationBytes + uVar4;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + allocRequest->size;
  UNLOCK();
  LOCK();
  paVar2 = (pVVar7->m_Budget).m_AllocationCount + uVar4;
  (paVar2->super___atomic_base<unsigned_int>)._M_i =
       (paVar2->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  LOCK();
  paVar2 = &(pVVar7->m_Budget).m_OperationsSinceBudgetFetch;
  (paVar2->super___atomic_base<unsigned_int>)._M_i =
       (paVar2->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  return VK_SUCCESS;
}

Assistant:

VkResult VmaBlockVector::CommitAllocationRequest(
    VmaAllocationRequest& allocRequest,
    VmaDeviceMemoryBlock* pBlock,
    VkDeviceSize alignment,
    VmaAllocationCreateFlags allocFlags,
    void* pUserData,
    VmaSuballocationType suballocType,
    VmaAllocation* pAllocation)
{
    const bool mapped = (allocFlags & VMA_ALLOCATION_CREATE_MAPPED_BIT) != 0;
    const bool isUserDataString = (allocFlags & VMA_ALLOCATION_CREATE_USER_DATA_COPY_STRING_BIT) != 0;
    const bool isMappingAllowed = (allocFlags &
        (VMA_ALLOCATION_CREATE_HOST_ACCESS_SEQUENTIAL_WRITE_BIT | VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT)) != 0;

    pBlock->PostAlloc();
    // Allocate from pCurrBlock.
    if (mapped)
    {
        VkResult res = pBlock->Map(m_hAllocator, 1, VMA_NULL);
        if (res != VK_SUCCESS)
        {
            return res;
        }
    }

    *pAllocation = m_hAllocator->m_AllocationObjectAllocator.Allocate(isMappingAllowed);
    pBlock->m_pMetadata->Alloc(allocRequest, suballocType, *pAllocation);
    (*pAllocation)->InitBlockAllocation(
        pBlock,
        allocRequest.allocHandle,
        alignment,
        allocRequest.size, // Not size, as actual allocation size may be larger than requested!
        m_MemoryTypeIndex,
        suballocType,
        mapped);
    VMA_HEAVY_ASSERT(pBlock->Validate());
    if (isUserDataString)
        (*pAllocation)->SetName(m_hAllocator, (const char*)pUserData);
    else
        (*pAllocation)->SetUserData(m_hAllocator, pUserData);
    m_hAllocator->m_Budget.AddAllocation(m_hAllocator->MemoryTypeIndexToHeapIndex(m_MemoryTypeIndex), allocRequest.size);
    if (VMA_DEBUG_INITIALIZE_ALLOCATIONS)
    {
        m_hAllocator->FillAllocation(*pAllocation, VMA_ALLOCATION_FILL_PATTERN_CREATED);
    }
    if (IsCorruptionDetectionEnabled())
    {
        VkResult res = pBlock->WriteMagicValueAfterAllocation(m_hAllocator, (*pAllocation)->GetOffset(), allocRequest.size);
        VMA_ASSERT(res == VK_SUCCESS && "Couldn't map block memory to write magic value.");
    }
    return VK_SUCCESS;
}